

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<kj::Directory::Replacer<kj::Directory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::replaceSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  Directory **params_2;
  size_t sVar1;
  String *pSVar2;
  Own<const_kj::Directory> *pOVar3;
  Own<const_kj::Directory> *this_00;
  Directory *pDVar4;
  Impl *pIVar5;
  undefined4 in_register_0000000c;
  Replacer<kj::Directory> *extraout_RDX;
  Replacer<kj::Directory> *extraout_RDX_00;
  Replacer<kj::Directory> *extraout_RDX_01;
  Replacer<kj::Directory> *pRVar6;
  uint in_R8D;
  Own<kj::Directory::Replacer<kj::Directory>_> OVar7;
  StringPtr name;
  Own<kj::Directory> local_d0;
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_> local_c0;
  uint local_ac;
  ArrayPtr<const_kj::String> local_a8;
  StringPtr local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  OwnOwn<const_kj::Directory> child;
  Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>_> local_58 [2];
  Fault local_38;
  Fault f;
  WriteMode mode_local;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (InMemoryDirectory *)path.parts.size_;
  name.content.ptr = (InMemoryDirectory *)path.parts.ptr;
  f.exception._4_4_ = in_R8D;
  path_local.parts.size_ = (size_t)this;
  sVar1 = PathPtr::size((PathPtr *)&this_local);
  if (sVar1 == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x4a9,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    _::Debug::Fault::~Fault(&local_38);
  }
  else {
    sVar1 = PathPtr::size((PathPtr *)&this_local);
    if (sVar1 == 1) {
      pSVar2 = PathPtr::operator[]((PathPtr *)&this_local,0);
      pIVar5 = MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::getWithoutLock
                         (&(name.content.ptr)->impl);
      params_2 = &child.value.ptr;
      newInMemoryDirectory((kj *)params_2,pIVar5->clock);
      heap<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>,kj::(anonymous_namespace)::InMemoryDirectory_const&,kj::String_const&,kj::Own<kj::Directory>,kj::WriteMode&>
                ((kj *)local_58,name.content.ptr,pSVar2,(Own<kj::Directory> *)params_2,
                 (WriteMode *)((long)&f.exception + 4));
      Own<kj::Directory::Replacer<kj::Directory>>::
      Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>,void>
                ((Own<kj::Directory::Replacer<kj::Directory>> *)this,local_58);
      Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>_>::~Own
                (local_58);
      Own<kj::Directory>::~Own((Own<kj::Directory> *)&child.value.ptr);
      pRVar6 = extraout_RDX;
      goto LAB_003ed284;
    }
    pSVar2 = PathPtr::operator[]((PathPtr *)&this_local,0);
    StringPtr::StringPtr(&local_98,pSVar2);
    name.content.size_ = (size_t)local_98.content.ptr;
    tryGetParent((InMemoryDirectory *)local_88,name,(WriteMode)local_98.content.size_);
    _::readMaybe<kj::Directory_const>
              ((_ *)local_78,(Maybe<kj::Own<const_kj::Directory>_> *)local_88);
    Maybe<kj::Own<const_kj::Directory>_>::~Maybe((Maybe<kj::Own<const_kj::Directory>_> *)local_88);
    pOVar3 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_78);
    if (pOVar3 != (Own<const_kj::Directory> *)0x0) {
      this_00 = _::OwnOwn<const_kj::Directory>::operator->((OwnOwn<const_kj::Directory> *)local_78);
      pDVar4 = Own<const_kj::Directory>::get(this_00);
      sVar1 = PathPtr::size((PathPtr *)&this_local);
      local_a8 = (ArrayPtr<const_kj::String>)PathPtr::slice((PathPtr *)&this_local,1,sVar1);
      (*(pDVar4->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x12])
                (this,pDVar4,local_a8.ptr,local_a8.size_,(ulong)f.exception._4_4_);
    }
    local_ac = (uint)(pOVar3 != (Own<const_kj::Directory> *)0x0);
    _::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_78);
    pRVar6 = extraout_RDX_00;
    if (local_ac != 0) goto LAB_003ed284;
  }
  pIVar5 = MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::getWithoutLock
                     (&(name.content.ptr)->impl);
  newInMemoryDirectory((kj *)&local_d0,pIVar5->clock);
  heap<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>,kj::Own<kj::Directory>>
            ((kj *)&local_c0,&local_d0);
  Own<kj::Directory::Replacer<kj::Directory>>::
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>,void>
            ((Own<kj::Directory::Replacer<kj::Directory>> *)this,&local_c0);
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_>::~Own(&local_c0)
  ;
  Own<kj::Directory>::~Own(&local_d0);
  pRVar6 = extraout_RDX_01;
LAB_003ed284:
  OVar7.ptr = pRVar6;
  OVar7.disposer = (Disposer *)this;
  return OVar7;
}

Assistant:

Own<Replacer<Directory>> replaceSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
    } else if (path.size() == 1) {
      // don't need lock just to read the clock ref
      return heap<ReplacerImpl<Directory>>(*this, path[0],
          newInMemoryDirectory(impl.getWithoutLock().clock), mode);
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->replaceSubdir(path.slice(1, path.size()), mode);
      }
    }
    return heap<BrokenReplacer<Directory>>(newInMemoryDirectory(impl.getWithoutLock().clock));
  }